

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shutdown.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  char *__format;
  char *pcVar5;
  FILE *pFVar6;
  undefined8 uVar7;
  char socket_address [128];
  
  if (argc < 2) {
    pcVar5 = "5555";
  }
  else {
    pcVar5 = argv[1];
  }
  uVar1 = atoi(pcVar5);
  sprintf(socket_address,"%s://%s:%d","tcp","127.0.0.1",(ulong)uVar1);
  iVar2 = nn_socket(1,0x30);
  pFVar6 = _stderr;
  if (iVar2 != -1) {
    iVar3 = nn_connect(iVar2,socket_address);
    pFVar6 = _stderr;
    if (iVar3 < 0) {
      puVar4 = (uint *)__errno_location();
      pcVar5 = nn_err_strerror(*puVar4);
      fprintf(pFVar6,"Failed connect to \"%s\": %s [%d] (%s:%d)\n",socket_address,pcVar5,
              (ulong)*puVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/shutdown.c"
              ,0x2a);
      nn_err_abort();
    }
    iVar3 = nn_shutdown(iVar2,iVar3);
    if (iVar3 != 0) {
      nn_backtrace_print();
      pFVar6 = _stderr;
      puVar4 = (uint *)__errno_location();
      pcVar5 = nn_err_strerror(*puVar4);
      fprintf(pFVar6,"%s [%d] (%s:%d)\n",pcVar5,(ulong)*puVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/shutdown.c"
              ,0x2c);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar2 = nn_close(iVar2);
    if (iVar2 != 0) {
      puVar4 = (uint *)__errno_location();
      pFVar6 = _stderr;
      uVar1 = *puVar4;
      if ((uVar1 != 9) && (uVar1 != 0x9523dfd)) {
        pcVar5 = nn_err_strerror(uVar1);
        uVar1 = *puVar4;
        __format = "Failed to close socket: %s [%d] (%s:%d)\n";
        uVar7 = 0x2d;
        goto LAB_001014c3;
      }
    }
    return 0;
  }
  puVar4 = (uint *)__errno_location();
  pcVar5 = nn_err_strerror(*puVar4);
  uVar1 = *puVar4;
  __format = "Failed create socket: %s [%d] (%s:%d)\n";
  uVar7 = 0x29;
LAB_001014c3:
  fprintf(pFVar6,__format,pcVar5,(ulong)uVar1,
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/shutdown.c",
          uVar7);
  nn_err_abort();
}

Assistant:

int main (int argc, const char *argv[])
{
    int s;
    int rc;
    int eid;
    char socket_address[128];

    test_addr_from(socket_address, "tcp", "127.0.0.1",
            get_test_port(argc, argv));

    /*  Run endpoint shutdown and socket shutdown in parallel. */
    s = test_socket (AF_SP, NN_REQ);
    eid = test_connect (s, socket_address);
    rc = nn_shutdown (s, eid);
    errno_assert (rc == 0);
    test_close (s);

    return 0;
}